

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

uint __thiscall ADE_DEP_DPFSP::valutaIndividuo(ADE_DEP_DPFSP *this,Permutazione *p)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint **ppuVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  ulong uVar11;
  __array Cm;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> local_40;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> local_38;
  
  std::make_unique<unsigned_int[]>((size_t)&local_40);
  uVar1 = (this->istanza).lavori;
  uVar7 = ((uint)uVar1 + (uint)(this->istanza).fabbriche) - 1;
  uVar6 = (ulong)(this->istanza).macchine;
  uVar9 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar9;
  }
  local_38._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
       (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
       local_40._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  uVar7 = 0;
  sVar10 = 0;
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    uVar2 = p->individuo[uVar9];
    if (uVar2 < uVar1) {
      ppuVar5 = (this->istanza).p;
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        if (sVar10 == 0 && (short)uVar11 == 0) {
          *(uint *)((long)local_40._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + uVar11 * 4) =
               *ppuVar5[uVar2];
        }
        else if (uVar11 == 0 || sVar10 == 0) {
          if (sVar10 == 0 && uVar11 != 0) {
            *(uint *)((long)local_40._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + uVar11 * 4)
                 = ((int *)((long)local_40._M_t.
                                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + -4))
                   [uVar11] + ppuVar5[uVar2][uVar11];
          }
          else {
            *(uint *)local_40._M_t.
                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                     super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 *(int *)local_40._M_t.
                         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                 *ppuVar5[uVar2];
          }
        }
        else {
          uVar3 = *(uint *)((long)local_40._M_t.
                                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                           (ulong)((int)uVar11 - 1) * 4);
          uVar4 = *(uint *)((long)local_40._M_t.
                                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                           uVar11 * 4);
          if (uVar4 < uVar3) {
            uVar4 = uVar3;
          }
          *(uint *)((long)local_40._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + uVar11 * 4) =
               uVar4 + ppuVar5[uVar2][uVar11];
        }
      }
      sVar10 = sVar10 + 1;
    }
    else {
      if (uVar7 <= (uint)((int *)((long)local_40._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                                 -4))[uVar6]) {
        uVar7 = ((int *)((long)local_40._M_t.
                               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + -4))
                [uVar6];
      }
      sVar10 = 0;
    }
  }
  uVar3 = ((int *)((long)local_40._M_t.
                         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + -4))[uVar6];
  if ((uint)((int *)((long)local_40._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + -4))[uVar6]
      < uVar7) {
    uVar3 = uVar7;
  }
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&local_40);
  return uVar3;
}

Assistant:

unsigned int ADE_DEP_DPFSP::valutaIndividuo(Permutazione* p) {

	auto Cm = make_unique<unsigned int[]>(istanza.macchine);

	unsigned int Cmax = 0;
	short c = 0;

	for (unsigned short k = 0; k < istanza.lavori + istanza.fabbriche - 1; k++, c++) {

		if (p->individuo[k] >= istanza.lavori) {
			Cmax = max(Cmax, Cm[istanza.macchine - 1]);
			c = -1;
		}
		else {
			for (unsigned short j = 0; j < istanza.macchine; j++) {

				if (c == 0 && j == 0) {
					Cm[j] = istanza.p[p->individuo[k]][0];
				}
				else if (c != 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + max(Cm[j - 1], Cm[j]);
				}
				else if (c == 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + Cm[j - 1];
				}
				else {
					Cm[0] = istanza.p[p->individuo[k]][0] + Cm[0];
				}
			}
		}
	}

	return max(Cmax, Cm[istanza.macchine - 1]);
}